

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O2

void cmExpandList(string_view arg,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *argsOut,bool emptyArgs)

{
  char *pcVar1;
  char cVar2;
  size_type sVar3;
  char *__first;
  char *__last;
  int iVar4;
  char *__last_00;
  string newArg;
  string_view arg_local;
  
  arg_local._M_str = arg._M_str;
  arg_local._M_len = arg._M_len;
  if (arg_local._M_len != 0 || emptyArgs) {
    iVar4 = 0;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&arg_local,';',0);
    if (sVar3 == 0xffffffffffffffff) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)argsOut,
                 &arg_local);
    }
    else {
      newArg._M_dataplus._M_p = (pointer)&newArg.field_2;
      newArg._M_string_length = 0;
      newArg.field_2._M_local_buf[0] = '\0';
      __last_00 = arg_local._M_str + arg_local._M_len;
      __first = arg_local._M_str;
      for (__last = arg_local._M_str; __last != __last_00; __last = __last + 1) {
        cVar2 = *__last;
        if (cVar2 == ';') {
          if (iVar4 == 0) {
            std::__cxx11::string::append<char_const*,void>((string *)&newArg,__first,__last);
            __first = __last + 1;
            iVar4 = 0;
            if (newArg._M_string_length != 0 || emptyArgs) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(argsOut,&newArg);
              newArg._M_string_length = 0;
              *newArg._M_dataplus._M_p = '\0';
              iVar4 = 0;
            }
          }
        }
        else if (cVar2 == '[') {
          iVar4 = iVar4 + 1;
        }
        else if (cVar2 == ']') {
          iVar4 = iVar4 + -1;
        }
        else if (((cVar2 == '\\') && (pcVar1 = __last + 1, pcVar1 != __last_00)) && (*pcVar1 == ';')
                ) {
          std::__cxx11::string::append<char_const*,void>((string *)&newArg,__first,__last);
          __last = pcVar1;
          __first = pcVar1;
        }
      }
      std::__cxx11::string::append<char_const*,void>((string *)&newArg,__first,__last_00);
      if (newArg._M_string_length != 0 || emptyArgs) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)argsOut,
                   &newArg);
      }
      std::__cxx11::string::~string((string *)&newArg);
    }
  }
  return;
}

Assistant:

void cmExpandList(cm::string_view arg, std::vector<std::string>& argsOut,
                  bool emptyArgs)
{
  // If argument is empty, it is an empty list.
  if (!emptyArgs && arg.empty()) {
    return;
  }

  // if there are no ; in the name then just copy the current string
  if (arg.find(';') == cm::string_view::npos) {
    argsOut.emplace_back(arg);
    return;
  }

  std::string newArg;
  // Break the string at non-escaped semicolons not nested in [].
  int squareNesting = 0;
  cm::string_view::iterator last = arg.begin();
  cm::string_view::iterator const cend = arg.end();
  for (cm::string_view::iterator c = last; c != cend; ++c) {
    switch (*c) {
      case '\\': {
        // We only want to allow escaping of semicolons.  Other
        // escapes should not be processed here.
        cm::string_view::iterator cnext = c + 1;
        if ((cnext != cend) && *cnext == ';') {
          newArg.append(last, c);
          // Skip over the escape character
          last = cnext;
          c = cnext;
        }
      } break;
      case '[': {
        ++squareNesting;
      } break;
      case ']': {
        --squareNesting;
      } break;
      case ';': {
        // Break the string here if we are not nested inside square
        // brackets.
        if (squareNesting == 0) {
          newArg.append(last, c);
          // Skip over the semicolon
          last = c + 1;
          if (!newArg.empty() || emptyArgs) {
            // Add the last argument if the string is not empty.
            argsOut.push_back(newArg);
            newArg.clear();
          }
        }
      } break;
      default: {
        // Just append this character.
      } break;
    }
  }
  newArg.append(last, cend);
  if (!newArg.empty() || emptyArgs) {
    // Add the last argument if the string is not empty.
    argsOut.push_back(std::move(newArg));
  }
}